

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.hpp
# Opt level: O2

void __thiscall inja::DataNode::DataNode(DataNode *this,string_view ptr_name,size_t pos)

{
  string_view ptr_name_00;
  string sStack_48;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  
  local_28._M_str = ptr_name._M_str;
  local_28._M_len = ptr_name._M_len;
  (this->super_ExpressionNode).super_AstNode.pos = pos;
  (this->super_ExpressionNode).super_AstNode._vptr_AstNode = (_func_int **)&PTR_accept_0019cc98;
  ::std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&this->name,&local_28,(allocator<char> *)&sStack_48);
  ptr_name_00._M_str = (char *)pos;
  ptr_name_00._M_len = (size_t)local_28._M_str;
  convert_dot_to_ptr_abi_cxx11_(&sStack_48,(DataNode *)local_28._M_len,ptr_name_00);
  nlohmann::json_abi_v3_11_3::
  json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  split(&(this->ptr).reference_tokens,&sStack_48);
  ::std::__cxx11::string::~string((string *)&sStack_48);
  return;
}

Assistant:

explicit DataNode(std::string_view ptr_name, size_t pos): ExpressionNode(pos), name(ptr_name), ptr(json::json_pointer(convert_dot_to_ptr(ptr_name))) {}